

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

int Sbd_ManCollectConstantsNew
              (sat_solver *pSat,Vec_Int_t *vDivVars,int nConsts,int PivotVar,word *pOnset,
              word *pOffset)

{
  ulong *puVar1;
  int iVar2;
  word *pwVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int iLit;
  word *pPats [2];
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  undefined8 local_50;
  word *local_48 [3];
  
  local_50 = CONCAT44(in_register_0000000c,PivotVar);
  local_48[0] = pOnset;
  local_48[1] = pOffset;
  if (0x3f < vDivVars->nSize) {
    __assert_fail("Vec_IntSize(vDivVars) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0x1b6,
                  "int Sbd_ManCollectConstantsNew(sat_solver *, Vec_Int_t *, int, int, word *, word *)"
                 );
  }
  local_60 = (ulong)(uint)(PivotVar * 2);
  local_58 = (ulong)(uint)nConsts;
  uVar9 = 0;
  local_64 = nConsts;
  do {
    if (0 < local_64) {
      iVar5 = (int)local_60;
      uVar8 = 0;
      do {
        sat_solver_random_polarity(pSat);
        if ((int)local_50 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        local_68 = iVar5 + (int)uVar9;
        iVar6 = sat_solver_solve(pSat,&local_68,&local_64,0,0,0,0);
        if (iVar6 == -1) goto LAB_00547b2a;
        if (iVar6 == 0) {
          uVar9 = 0xfffffffe;
          goto LAB_00547b2a;
        }
        iVar6 = vDivVars->nSize;
        pwVar3 = local_48[uVar9];
        pwVar3[uVar8] = (uVar9 & 0xffffffff ^ 1) << ((byte)iVar6 & 0x3f);
        if (0 < (long)iVar6) {
          piVar4 = vDivVars->pArray;
          uVar7 = 0;
          do {
            iVar2 = piVar4[uVar7];
            if (((long)iVar2 < 0) || (pSat->size <= iVar2)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            if (pSat->model[iVar2] == 1) {
              puVar1 = pwVar3 + uVar8 + (uVar7 >> 6 & 0x3ffffff);
              *puVar1 = *puVar1 ^ 1L << ((byte)uVar7 & 0x3f);
            }
            uVar7 = uVar7 + 1;
          } while ((long)iVar6 != uVar7);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != local_58);
    }
    bVar10 = uVar9 != 0;
    uVar9 = uVar9 + 1;
    if (bVar10) {
      uVar9 = 0xffffffff;
LAB_00547b2a:
      return (int)uVar9;
    }
  } while( true );
}

Assistant:

int Sbd_ManCollectConstantsNew( sat_solver * pSat, Vec_Int_t * vDivVars, int nConsts, int PivotVar, word * pOnset, word * pOffset )
{
    int nBTLimit = 0;
    int n, i, k, status, iLit, iVar; 
    word * pPats[2] = {pOnset, pOffset};
    assert( Vec_IntSize(vDivVars) < 64 );
    for ( n = 0; n < 2; n++ )
    for ( i = 0; i < nConsts; i++ )
    {
        sat_solver_random_polarity( pSat );
        iLit = Abc_Var2Lit( PivotVar, n );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return n;
        pPats[n][i] = ((word)!n) << Vec_IntSize(vDivVars);
        Vec_IntForEachEntry( vDivVars, iVar, k )
            if ( sat_solver_var_value(pSat, iVar) )
                Abc_TtXorBit(&pPats[n][i], k);
    }
    return -1;
}